

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O0

int nametree_clean(ndn_nametree_t *nametree,int num)

{
  int iVar1;
  int ret;
  int num_local;
  ndn_nametree_t *nametree_local;
  
  if (num == 0xffff) {
    nametree_local._4_4_ = 0xffff;
  }
  else {
    iVar1 = nametree_clean(nametree,(uint)*(ushort *)(nametree + (long)num * 0x2e + 0x26));
    *(short *)(nametree + (long)num * 0x2e + 0x26) = (short)iVar1;
    iVar1 = nametree_clean(nametree,(uint)*(ushort *)(nametree + (long)num * 0x2e + 0x28));
    *(short *)(nametree + (long)num * 0x2e + 0x28) = (short)iVar1;
    nametree_local._4_4_ = num;
    if (((*(short *)(nametree + (long)num * 0x2e + 0x2c) == -1) &&
        (*(short *)(nametree + (long)num * 0x2e + 0x2a) == -1)) &&
       (*(short *)(nametree + (long)num * 0x2e + 0x26) == -1)) {
      nametree_local._4_4_ = (uint)*(ushort *)(nametree + (long)num * 0x2e + 0x28);
      nametree_refresh(nametree,num);
    }
  }
  return nametree_local._4_4_;
}

Assistant:

static int
nametree_clean(ndn_nametree_t *nametree, int num)
{
  int ret = 0;
  if (num == NDN_INVALID_ID) {
    return NDN_INVALID_ID;
  }
  else {
    (*nametree)[num].left_child = nametree_clean(nametree, (*nametree)[num].left_child);
    (*nametree)[num].right_bro = nametree_clean(nametree, (*nametree)[num].right_bro);
    if ((*nametree)[num].fib_id == NDN_INVALID_ID &&
        (*nametree)[num].pit_id == NDN_INVALID_ID &&
        (*nametree)[num].left_child == NDN_INVALID_ID) {
      ret = (*nametree)[num].right_bro;
      nametree_refresh(nametree, num);
      return ret;
    }
    else {
      return num;
    }
  }
}